

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O2

ON_wString
ON_NTimesPowerOf10AsString
          (double value,double tol,ON_wString *g_format,ON__UINT64 n,int e,double *clean_value)

{
  bool bVar1;
  int ie;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  undefined4 in_register_00000014;
  ulong uVar5;
  ulong uVar6;
  double *in_R8;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double y;
  wchar_t sf [32];
  
  uVar5 = CONCAT44(in_register_00000014,e);
  uVar3 = (ulong)clean_value & 0xffffffff;
  if (in_R8 != (double *)0x0) {
    *in_R8 = value;
  }
  bVar1 = ON_IsValid(value);
  if (((bVar1) && (ABS(value) < 1e+18)) && (1e-18 < ABS(value))) {
    uVar4 = 1;
    if ((int)clean_value < 0) {
      for (iVar2 = 0; (int)clean_value < iVar2; iVar2 = iVar2 + -1) {
        uVar4 = uVar4 * 10;
      }
      auVar9._8_4_ = in_register_00000014;
      auVar9._0_8_ = uVar5;
      auVar9._12_4_ = 0x45300000;
      auVar13._8_4_ = (int)(uVar4 >> 0x20);
      auVar13._0_8_ = uVar4;
      auVar13._12_4_ = 0x45300000;
      dVar7 = (auVar13._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0);
      if ((auVar9._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,e) - 4503599627370496.0) <= dVar7 * 1e-18) goto LAB_005cb7ac;
      uVar3 = uVar5 / uVar4;
      uVar5 = uVar5 % uVar4;
    }
    else {
      while (iVar2 = (int)uVar3, uVar3 = (ulong)(iVar2 - 1), iVar2 != 0) {
        uVar4 = uVar4 * 10;
      }
      auVar8._8_4_ = in_register_00000014;
      auVar8._0_8_ = uVar5;
      auVar8._12_4_ = 0x45300000;
      auVar12._8_4_ = (int)(uVar4 >> 0x20);
      auVar12._0_8_ = uVar4;
      auVar12._12_4_ = 0x45300000;
      dVar7 = (auVar12._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0);
      if (1e+18 <= ((auVar8._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,e) - 4503599627370496.0)) * dVar7)
      goto LAB_005cb7ac;
      uVar3 = uVar5 * uVar4;
      uVar5 = 0;
    }
    auVar11._8_4_ = (int)(uVar3 >> 0x20);
    auVar11._0_8_ = uVar3;
    auVar11._12_4_ = 0x45300000;
    auVar14._8_4_ = (int)(uVar5 >> 0x20);
    auVar14._0_8_ = uVar5;
    auVar14._12_4_ = 0x45300000;
    dVar7 = ((auVar14._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) / dVar7 +
            (auVar11._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
    if (ABS(dVar7 - value) <= tol) {
      if (uVar5 == 0) {
        if (in_R8 != (double *)0x0) {
          *in_R8 = dVar7;
        }
        ON_wString::FormatToString((wchar_t *)g_format,L"%llu",uVar3);
        return (ON_wString)(wchar_t *)g_format;
      }
      sf[0x1c] = L'\0';
      sf[0x1d] = L'\0';
      sf[0x1e] = L'\0';
      sf[0x1f] = L'\0';
      sf[0x18] = L'\0';
      sf[0x19] = L'\0';
      sf[0x1a] = L'\0';
      sf[0x1b] = L'\0';
      sf[0x14] = L'\0';
      sf[0x15] = L'\0';
      sf[0x16] = L'\0';
      sf[0x17] = L'\0';
      sf[0x10] = L'\0';
      sf[0x11] = L'\0';
      sf[0x12] = L'\0';
      sf[0x13] = L'\0';
      sf[0xc] = L'\0';
      sf[0xd] = L'\0';
      sf[0xe] = L'\0';
      sf[0xf] = L'\0';
      sf[8] = L'\0';
      sf[9] = L'\0';
      sf[10] = L'\0';
      sf[0xb] = L'\0';
      sf[4] = L'\0';
      sf[5] = L'\0';
      sf[6] = L'\0';
      sf[7] = L'\0';
      sf[0] = L'\0';
      sf[1] = L'\0';
      sf[2] = L'\0';
      sf[3] = L'\0';
      for (uVar6 = 0; (9 < uVar4 && (uVar6 < 0x20)); uVar6 = uVar6 + 1) {
        uVar4 = uVar4 / 10;
        sf[uVar6] = (uint)((uVar5 / uVar4) % 10) | 0x30;
      }
      ON_wString::FormatToString((wchar_t *)g_format,L"%llu.%ls",uVar3,sf);
      dVar7 = ON_DBL_QNAN;
      iVar2 = ON_wString::Scan(g_format,L"%lf");
      if (iVar2 == 1) {
        dVar10 = ABS(dVar7 - value);
        if ((in_R8 != (double *)0x0) && (dVar10 <= tol)) {
          *in_R8 = dVar7;
          return (ON_wString)(wchar_t *)g_format;
        }
        if (dVar10 <= tol) {
          return (ON_wString)(wchar_t *)g_format;
        }
      }
      ON_wString::~ON_wString(g_format);
    }
  }
LAB_005cb7ac:
  ON_wString::ON_wString(g_format,(ON_wString *)n);
  return (ON_wString)(wchar_t *)g_format;
}

Assistant:

static
const ON_wString ON_NTimesPowerOf10AsString(
  double value,
  double tol,
  const ON_wString& g_format,
  ON__UINT64 n,
  int e,
  double* clean_value
)
{
  if (nullptr != clean_value)
    *clean_value = value;

  if ( false == ON_IsValid(value) )
    return ON_NTimesPowerOf10AsStringFail(g_format,false); // value is a nan or UNSET value.

  // ON__UINT64 range is 0 to 18,446,744,073,709,551,615 = 1.8...e19
  const double max_pretty_value = 1.0e18; // must be <= 18,446,744,073,709,551,615 ( 20 decimal digits )
  const double min_pretty_value = 1.0 / max_pretty_value;
  if (fabs(value) >= max_pretty_value || fabs(value) <= min_pretty_value)
    return ON_NTimesPowerOf10AsStringFail(g_format,false); // value is too big or too small for a "pretty" format.
  

  // returns n*(10^e) as a "pretty" string - no exponential notation that disturbs users.
  ON__UINT64 q = 1;
  ON__UINT64 i = 0;
  ON__UINT64 f = 0;

  if (e >= 0)
  {
    for (int ie = 0; ie < e; ie++)
      q *= 10;

    if (fabs((double)n)*fabs((double)q) >= max_pretty_value)
      return ON_NTimesPowerOf10AsStringFail(g_format,false);

    i = n*q;
    f = 0;
  }
  else
  {
    // e is negative
    for (int ie = 0; ie > e; ie--)
      q *= 10;
    if (fabs((double)n) <= min_pretty_value*fabs((double)q))
      return ON_NTimesPowerOf10AsStringFail(g_format,false);

    i = n / q;
    f = n % q;
  }

  const double x = ((double)i) + ((double)f) / ((double)q);
  if (fabs(x - value) <= tol)
  {
    if (0 == f)
    {
      if (nullptr != clean_value)
        *clean_value = x;
      return ON_wString::FormatToString(L"%llu", i);
    }
    wchar_t sf[32] = { 0 }; // 32 is more than enough to hold the maximum of 20 digits
    size_t sf_capacity = sizeof(sf) / sizeof(sf[i]);
    size_t sfi = 0;
    for (ON__UINT64 r = q / 10; r > 0 && sfi < sf_capacity; r /= 10)
    {
      sf[sfi++] = (wchar_t)(int((f / r)%10) + '0');
    }
    const ON_wString value_as_string = ON_wString::FormatToString(L"%llu.%ls", i, sf);
    double y = ON_DBL_QNAN;
    const int scan_count = value_as_string.Scan( L"%lf", &y );
    if (1 == scan_count && fabs(y - value) <= tol)
    {
      if (nullptr != clean_value)
        *clean_value = y;
      return value_as_string;
    }
  }

  return ON_NTimesPowerOf10AsStringFail(g_format,false);
}